

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFlushFinishTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_0::FlushFinishCase::iterate(FlushFinishCase *this)

{
  int numDrawCalls;
  size_type sVar1;
  deUint64 dVar2;
  deUint64 dVar3;
  deUint64 dVar4;
  reference pvVar5;
  qpWatchDog *pqVar6;
  deUint64 readFinishTime;
  deUint64 readStartTime;
  deUint64 waitStartTime;
  ulong uStack_78;
  int drawCallCount;
  size_t ndx;
  Random rnd;
  CalibrationFailedException *e;
  CalibrationParams local_48 [2];
  CalibrationParams params;
  allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample> local_31;
  undefined1 local_30 [8];
  vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  samples;
  FlushFinishCase *this_local;
  
  samples.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>::allocator
            (&local_31);
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ::vector((vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
            *)local_30,0x19,&local_31);
  std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>::
  ~allocator(&local_31);
  tcu::warmupCPU();
  setupRenderState(this);
  render(this,1);
  readPixels(this);
  local_48[0] = calibrate(this);
  de::Random::Random((Random *)((long)&ndx + 4),0x7b);
  uStack_78 = 0;
  while( true ) {
    sVar1 = std::
            vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
            ::size((vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                    *)local_30);
    if (sVar1 <= uStack_78) break;
    numDrawCalls = de::Random::getInt((Random *)((long)&ndx + 4),1,local_48[0].maxDrawCalls);
    render(this,numDrawCalls);
    dVar2 = deGetMicroseconds();
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    dVar3 = deGetMicroseconds();
    readPixels(this);
    dVar4 = deGetMicroseconds();
    pvVar5 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
             ::operator[]((vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                           *)local_30,uStack_78);
    pvVar5->numDrawCalls = numDrawCalls;
    pvVar5 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
             ::operator[]((vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                           *)local_30,uStack_78);
    pvVar5->waitTime = dVar3 - dVar2;
    pvVar5 = std::
             vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
             ::operator[]((vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                           *)local_30,uStack_78);
    pvVar5->readPixelsTime = dVar4 - dVar3;
    pqVar6 = tcu::TestContext::getWatchDog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (pqVar6 != (qpWatchDog *)0x0) {
      pqVar6 = tcu::TestContext::getWatchDog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      qpWatchDog_touch(pqVar6);
    }
    uStack_78 = uStack_78 + 1;
  }
  de::Random::~Random((Random *)((long)&ndx + 4));
  analyzeResults(this,(vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                       *)local_30,local_48);
  rnd.m_rnd.z = 1;
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ::~vector((vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
             *)local_30);
  return STOP;
}

Assistant:

FlushFinishCase::IterateResult FlushFinishCase::iterate (void)
{
	vector<Sample>		samples		(NUM_SAMPLES);
	CalibrationParams	params;

	tcu::warmupCPU();

	setupRenderState();

	// Do one full render cycle.
	{
		render(1);
		readPixels();
	}

	// Calibrate.
	try
	{
		params = calibrate();
	}
	catch (const CalibrationFailedException& e)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, e.what());
		return STOP;
	}

	// Do measurement.
	{
		de::Random	rnd		(123);

		for (size_t ndx = 0; ndx < samples.size(); ndx++)
		{
			const int	drawCallCount	= rnd.getInt(1, params.maxDrawCalls);
			deUint64	waitStartTime;
			deUint64	readStartTime;
			deUint64	readFinishTime;

			render(drawCallCount);

			waitStartTime = deGetMicroseconds();
			waitForGL();

			readStartTime = deGetMicroseconds();
			readPixels();
			readFinishTime = deGetMicroseconds();

			samples[ndx].numDrawCalls	= drawCallCount;
			samples[ndx].waitTime		= readStartTime-waitStartTime;
			samples[ndx].readPixelsTime	= readFinishTime-readStartTime;

			if (m_testCtx.getWatchDog())
				qpWatchDog_touch(m_testCtx.getWatchDog());
		}
	}

	// Analyze - sets test case result.
	analyzeResults(samples, params);

	return STOP;
}